

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O0

cio_error cio_uart_get_baud_rate(cio_uart *port,cio_uart_baud_rate *baud_rate)

{
  speed_t sVar1;
  speed_t speed;
  cio_error err;
  termios tty;
  cio_uart_baud_rate *baud_rate_local;
  cio_uart *port_local;
  
  if (port == (cio_uart *)0x0) {
    port_local._4_4_ = CIO_INVALID_ARGUMENT;
  }
  else {
    tty._52_8_ = baud_rate;
    port_local._4_4_ = get_current_settings(port,(termios *)&speed);
    if (port_local._4_4_ == CIO_SUCCESS) {
      sVar1 = cfgetispeed((termios *)&speed);
      if (sVar1 == 1) {
        *(undefined4 *)tty._52_8_ = 0;
      }
      else if (sVar1 == 2) {
        *(undefined4 *)tty._52_8_ = 1;
      }
      else if (sVar1 == 3) {
        *(undefined4 *)tty._52_8_ = 2;
      }
      else if (sVar1 == 4) {
        *(undefined4 *)tty._52_8_ = 3;
      }
      else if (sVar1 == 5) {
        *(undefined4 *)tty._52_8_ = 4;
      }
      else if (sVar1 == 6) {
        *(undefined4 *)tty._52_8_ = 5;
      }
      else if (sVar1 == 7) {
        *(undefined4 *)tty._52_8_ = 6;
      }
      else if (sVar1 == 8) {
        *(undefined4 *)tty._52_8_ = 7;
      }
      else if (sVar1 == 9) {
        *(undefined4 *)tty._52_8_ = 8;
      }
      else if (sVar1 == 10) {
        *(undefined4 *)tty._52_8_ = 9;
      }
      else if (sVar1 == 0xb) {
        *(undefined4 *)tty._52_8_ = 10;
      }
      else if (sVar1 == 0xc) {
        *(undefined4 *)tty._52_8_ = 0xb;
      }
      else if (sVar1 == 0xd) {
        *(undefined4 *)tty._52_8_ = 0xc;
      }
      else if (sVar1 == 0xe) {
        *(undefined4 *)tty._52_8_ = 0xd;
      }
      else if (sVar1 == 0xf) {
        *(undefined4 *)tty._52_8_ = 0xe;
      }
      else if (sVar1 == 0x1001) {
        *(undefined4 *)tty._52_8_ = 0xf;
      }
      else if (sVar1 == 0x1002) {
        *(undefined4 *)tty._52_8_ = 0x10;
      }
      else if (sVar1 == 0x1003) {
        *(undefined4 *)tty._52_8_ = 0x11;
      }
      else if (sVar1 == 0x1004) {
        *(undefined4 *)tty._52_8_ = 0x12;
      }
      else if (sVar1 == 0x1005) {
        *(undefined4 *)tty._52_8_ = 0x13;
      }
      else if (sVar1 == 0x1006) {
        *(undefined4 *)tty._52_8_ = 0x14;
      }
      else if (sVar1 == 0x1007) {
        *(undefined4 *)tty._52_8_ = 0x15;
      }
      else if (sVar1 == 0x1008) {
        *(undefined4 *)tty._52_8_ = 0x16;
      }
      else if (sVar1 == 0x1009) {
        *(undefined4 *)tty._52_8_ = 0x17;
      }
      else if (sVar1 == 0x100a) {
        *(undefined4 *)tty._52_8_ = 0x18;
      }
      else if (sVar1 == 0x100b) {
        *(undefined4 *)tty._52_8_ = 0x19;
      }
      else if (sVar1 == 0x100c) {
        *(undefined4 *)tty._52_8_ = 0x1a;
      }
      else if (sVar1 == 0x100d) {
        *(undefined4 *)tty._52_8_ = 0x1b;
      }
      else if (sVar1 == 0x100e) {
        *(undefined4 *)tty._52_8_ = 0x1c;
      }
      else {
        if (sVar1 != 0x100f) {
          return CIO_PROTOCOL_NOT_SUPPORTED;
        }
        *(undefined4 *)tty._52_8_ = 0x1d;
      }
      port_local._4_4_ = CIO_SUCCESS;
    }
  }
  return port_local._4_4_;
}

Assistant:

enum cio_error cio_uart_get_baud_rate(const struct cio_uart *port, enum cio_uart_baud_rate *baud_rate)
{
	if (cio_unlikely(port == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	struct termios tty;

	enum cio_error err = get_current_settings(port, &tty);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return err;
	}

	speed_t speed = cfgetispeed(&tty);
	switch (speed) {
	case B50:
		*baud_rate = CIO_UART_BAUD_RATE_50;
		break;
	case B75:
		*baud_rate = CIO_UART_BAUD_RATE_75;
		break;
	case B110:
		*baud_rate = CIO_UART_BAUD_RATE_110;
		break;
	case B134:
		*baud_rate = CIO_UART_BAUD_RATE_134;
		break;
	case B150:
		*baud_rate = CIO_UART_BAUD_RATE_150;
		break;
	case B200:
		*baud_rate = CIO_UART_BAUD_RATE_200;
		break;
	case B300:
		*baud_rate = CIO_UART_BAUD_RATE_300;
		break;
	case B600:
		*baud_rate = CIO_UART_BAUD_RATE_600;
		break;
	case B1200:
		*baud_rate = CIO_UART_BAUD_RATE_1200;
		break;
	case B1800:
		*baud_rate = CIO_UART_BAUD_RATE_1800;
		break;
	case B2400:
		*baud_rate = CIO_UART_BAUD_RATE_2400;
		break;
	case B4800:
		*baud_rate = CIO_UART_BAUD_RATE_4800;
		break;
	case B9600:
		*baud_rate = CIO_UART_BAUD_RATE_9600;
		break;
	case B19200:
		*baud_rate = CIO_UART_BAUD_RATE_19200;
		break;
	case B38400:
		*baud_rate = CIO_UART_BAUD_RATE_38400;
		break;
	case B57600:
		*baud_rate = CIO_UART_BAUD_RATE_57600;
		break;
	case B115200:
		*baud_rate = CIO_UART_BAUD_RATE_115200;
		break;
	case B230400:
		*baud_rate = CIO_UART_BAUD_RATE_230400;
		break;
	case B460800:
		*baud_rate = CIO_UART_BAUD_RATE_460800;
		break;
	case B500000:
		*baud_rate = CIO_UART_BAUD_RATE_500000;
		break;
	case B576000:
		*baud_rate = CIO_UART_BAUD_RATE_576000;
		break;
	case B921600:
		*baud_rate = CIO_UART_BAUD_RATE_921600;
		break;
	case B1000000:
		*baud_rate = CIO_UART_BAUD_RATE_1000000;
		break;
	case B1152000:
		*baud_rate = CIO_UART_BAUD_RATE_1152000;
		break;
	case B1500000:
		*baud_rate = CIO_UART_BAUD_RATE_1500000;
		break;
	case B2000000:
		*baud_rate = CIO_UART_BAUD_RATE_2000000;
		break;
	case B2500000:
		*baud_rate = CIO_UART_BAUD_RATE_2500000;
		break;
	case B3000000:
		*baud_rate = CIO_UART_BAUD_RATE_3000000;
		break;
	case B3500000:
		*baud_rate = CIO_UART_BAUD_RATE_3500000;
		break;
	case B4000000:
		*baud_rate = CIO_UART_BAUD_RATE_4000000;
		break;
	default:
		return CIO_PROTOCOL_NOT_SUPPORTED;
	}

	return CIO_SUCCESS;
}